

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O2

bool __thiscall ON_CheckSum::CheckFile(ON_CheckSum *this,FILE *fp,bool bSkipTimeCheck)

{
  bool bVar1;
  ON__UINT32 current_remainder;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong count;
  size_t sVar5;
  ulong uVar6;
  time_t filetime;
  size_t filesize;
  uchar buffer [1024];
  
  if (fp == (FILE *)0x0) {
    return false;
  }
  filesize = 0;
  filetime = 0;
  current_remainder = 0;
  bVar1 = ON::GetFileStats(fp,&filesize,(time_t *)0x0,&filetime);
  if ((!bVar1) || ((this->m_size == filesize && ((bSkipTimeCheck || (this->m_time == filetime))))))
  {
    lVar2 = 0x40000;
    sVar5 = 0x400;
    uVar6 = 0;
    uVar4 = 0;
    for (uVar3 = 0; uVar3 != 7; uVar3 = uVar3 + 1) {
      uVar6 = uVar6 + lVar2;
      while (((int)sVar5 == 0x400 && (uVar4 < uVar6))) {
        sVar5 = fread(buffer,1,0x400,(FILE *)fp);
        if (0 < (int)(uint)sVar5) {
          count = (ulong)((uint)sVar5 & 0x7fffffff);
          uVar4 = uVar4 + count;
          current_remainder = ON_CRC32(current_remainder,count,buffer);
        }
      }
      if (this->m_crc[uVar3] != current_remainder) {
        if (uVar3 < 7) {
          return false;
        }
        break;
      }
      lVar2 = lVar2 * 2;
    }
    while ((int)sVar5 == 0x400) {
      sVar5 = fread(buffer,1,0x400,(FILE *)fp);
      if ((int)(uint)sVar5 < 1) break;
      uVar3 = (ulong)((uint)sVar5 & 0x7fffffff);
      uVar4 = uVar4 + uVar3;
      current_remainder = ON_CRC32(current_remainder,uVar3,buffer);
    }
    if (this->m_crc[7] == current_remainder) {
      return uVar4 == this->m_size;
    }
  }
  return false;
}

Assistant:

bool ON_CheckSum::CheckFile( 
  FILE* fp,
  bool bSkipTimeCheck
  ) const
{
  if ( !fp )
    return false;

  size_t filesize=0;
  time_t filetime=0;
  if ( ON::GetFileStats( fp, &filesize, nullptr, &filetime ) )
  {
    if ( m_size != filesize )
    {
      return false;
    }

    if ( !bSkipTimeCheck && m_time != filetime)
    {
      return false;
    }
  }

  unsigned char buffer[1024];
  int count=1024;
  ON__UINT32 crc = 0;
  size_t sz0 = 0, maxsize = 0x40000;
  size_t sz = 0;

  for( int i = 0; i < 7; i++ )
  {
    sz0 += maxsize;
    while(1024 == count && sz < sz0)
    {
      count = (int)fread( buffer, 1, 1024, fp ); // the (int) is for 64 bit size_t conversion
      if ( count > 0 )
      {
        sz += count;
        crc = ON_CRC32( crc, count, buffer );
      }
    }
    maxsize *= 2;
    if ( m_crc[i] != crc )
      return false;
  }

  while(1024 == count)
  {
    count = (int)fread( buffer, 1, 1024, fp ); // the (int) is for 64 bit size_t conversion
    if ( count > 0 )
    {
      sz += count;
      crc = ON_CRC32( crc, count, buffer );
    }
  }
  if (m_crc[7] != crc)
    return false;

  if ( sz != m_size )
    return false;

  return true;
}